

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result wabt::ApplyNames(Module *module)

{
  Module *func;
  pointer pTVar1;
  pointer pTVar2;
  ElemSegment *pEVar3;
  Var *pVVar4;
  DataSegment *pDVar5;
  Result RVar6;
  Index IVar7;
  pointer ppFVar8;
  pointer ppGVar9;
  pointer ppEVar10;
  pointer ppEVar11;
  Table *pTVar12;
  pointer ppDVar13;
  Memory *pMVar14;
  char cVar15;
  Var *in_RCX;
  long lVar16;
  Var *pVVar17;
  ulong uVar18;
  Enum EVar19;
  bool bVar20;
  string_view name;
  string_view name_00;
  undefined1 local_d8 [8];
  NameApplier applier;
  
  local_d8 = (undefined1  [8])&PTR__NameApplier_0155a218;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  applier.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&applier.current_func_,(Delegate *)local_d8);
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar8 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar8) {
    bVar20 = true;
    pVVar17 = (Var *)0x0;
    applier.labels_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)module;
    do {
      func = (Module *)ppFVar8[(long)pVVar17];
      applier.module_ = func;
      if ((((FuncDeclaration *)&func->name)->has_func_type == true) &&
         (RVar6 = anon_unknown_7::NameApplier::UseNameForFuncTypeVar
                            ((NameApplier *)local_d8,&((FuncDeclaration *)&func->name)->type_var),
         RVar6.enum_ == Error)) {
LAB_00f3c825:
        EVar19 = Error;
        module = (Module *)
                 applier.labels_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (bVar20) goto LAB_00f3ca64;
        break;
      }
      pTVar1 = (((FuncSignature *)&func->excepts)->param_types).
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (((FuncSignature *)&func->excepts)->param_types).
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      IVar7 = LocalTypes::size((LocalTypes *)&func->globals);
      MakeTypeBindingReverseMapping
                ((ulong)(IVar7 + (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 2)),
                 (BindingHash *)&func->imports,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&applier.visitor_.expr_iter_stack_.
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      RVar6 = ExprVisitor::VisitFunc((ExprVisitor *)&applier.current_func_,(Func *)func);
      if (RVar6.enum_ == Error) goto LAB_00f3c825;
      applier.module_ = (Module *)0x0;
      pVVar17 = (Var *)((long)&(pVVar17->loc).filename.data_ + 1);
      ppFVar8 = (pointer)applier.labels_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_string_length;
      in_RCX = (Var *)((long)(applier.labels_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage[4].field_2.
                              _M_allocated_capacity - (long)ppFVar8) >> 3);
      bVar20 = pVVar17 < in_RCX;
      module = (Module *)
               applier.labels_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (bVar20);
  }
  ppGVar9 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar9) {
    bVar20 = true;
    pVVar17 = (Var *)0x0;
    do {
      RVar6 = ExprVisitor::VisitExprList
                        ((ExprVisitor *)&applier.current_func_,&ppGVar9[(long)pVVar17]->init_expr);
      if (RVar6.enum_ == Error) {
        EVar19 = Error;
        if (bVar20) goto LAB_00f3ca64;
        break;
      }
      pVVar17 = (Var *)((long)&(pVVar17->loc).filename.data_ + 1);
      ppGVar9 = (module->globals).
                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->globals).
                             super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar9 >> 3);
      bVar20 = pVVar17 < in_RCX;
    } while (bVar20);
  }
  ppEVar10 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar10) {
    pVVar17 = (Var *)0x0;
    do {
      if (ppEVar10[(long)pVVar17]->kind == First) {
        anon_unknown_7::NameApplier::UseNameForFuncVar
                  ((NameApplier *)local_d8,&ppEVar10[(long)pVVar17]->var);
      }
      pVVar17 = (Var *)((long)&(pVVar17->loc).filename.data_ + 1);
      ppEVar10 = (module->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->exports).
                             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10 >> 3);
    } while (pVVar17 < in_RCX);
  }
  ppEVar11 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar11) {
    in_RCX = (Var *)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    uVar18 = 0;
    do {
      cVar15 = (char)in_RCX;
      pEVar3 = ppEVar11[uVar18];
      pTVar12 = Module::GetTable((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                                 &pEVar3->table_var);
      if (pTVar12 == (Table *)0x0) {
LAB_00f3c9be:
        EVar19 = Error;
        if (cVar15 != '\0') goto LAB_00f3ca64;
        break;
      }
      name.size_ = (size_type)&pEVar3->table_var;
      name.data_ = (char *)(pTVar12->name)._M_string_length;
      anon_unknown_7::NameApplier::UseNameForVar
                ((NameApplier *)(pTVar12->name)._M_dataplus._M_p,name,in_RCX);
      RVar6 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pEVar3->offset);
      if (RVar6.enum_ == Error) goto LAB_00f3c9be;
      pVVar17 = (pEVar3->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar4 = (pEVar3->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar20 = pVVar17 == pVVar4;
      if (!bVar20) {
        RVar6 = anon_unknown_7::NameApplier::UseNameForFuncVar((NameApplier *)local_d8,pVVar17);
        while( true ) {
          if (RVar6.enum_ == Error) goto LAB_00f3c9be;
          pVVar17 = pVVar17 + 1;
          bVar20 = pVVar17 == pVVar4;
          if (bVar20) break;
          RVar6 = anon_unknown_7::NameApplier::UseNameForFuncVar((NameApplier *)local_d8,pVVar17);
        }
      }
      if (!bVar20) goto LAB_00f3c9be;
      uVar18 = uVar18 + 1;
      ppEVar11 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar16 = (long)(module->elem_segments).
                     super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar11;
      bVar20 = uVar18 < (ulong)(lVar16 >> 3);
      in_RCX = (Var *)CONCAT71((int7)(lVar16 >> 0xb),bVar20);
    } while (bVar20);
  }
  ppDVar13 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar13) {
    bVar20 = true;
    pVVar17 = (Var *)0x0;
    do {
      pDVar5 = ppDVar13[(long)pVVar17];
      pVVar4 = &pDVar5->memory_var;
      pMVar14 = Module::GetMemory((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                                  pVVar4);
      if (pMVar14 == (Memory *)0x0) {
LAB_00f3ca4a:
        EVar19 = Error;
        if (bVar20) goto LAB_00f3ca64;
        break;
      }
      name_00.size_ = (size_type)pVVar4;
      name_00.data_ = (char *)(pMVar14->name)._M_string_length;
      anon_unknown_7::NameApplier::UseNameForVar
                ((NameApplier *)(pMVar14->name)._M_dataplus._M_p,name_00,in_RCX);
      RVar6 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pDVar5->offset);
      if (RVar6.enum_ == Error) goto LAB_00f3ca4a;
      pVVar17 = (Var *)((long)&(pVVar17->loc).filename.data_ + 1);
      ppDVar13 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      in_RCX = (Var *)((long)(module->data_segments).
                             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar13 >> 3);
      bVar20 = pVVar17 < in_RCX;
    } while (bVar20);
  }
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  EVar19 = Ok;
LAB_00f3ca64:
  local_d8 = (undefined1  [8])&PTR__NameApplier_0155a218;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&applier.param_and_local_index_to_name_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&applier.visitor_.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (applier.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(applier.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (applier.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(applier.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (applier.visitor_.delegate_ != (Delegate *)0x0) {
    operator_delete(applier.visitor_.delegate_);
  }
  return (Result)EVar19;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}